

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_long<std::__cxx11::string,boost::optional<int>,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *param_2,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_3,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *v_00;
  char *s;
  shared_ptr<boost::optional<int>_> local_100;
  uint local_ec;
  string_type local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string_type local_78;
  shared_ptr<int> v;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__e_,_boost::optional<int>_>
  *flg_local;
  shared_ptr<boost::optional<int>_> *value_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *param_2_local;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *match_local;
  parse_flag_long<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::optional<int>,_void>
  *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  param_3_local;
  
  pvVar2 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](match,2);
  if ((pvVar2->matched & 1U) == 0) {
    std::make_shared<boost::optional<int>>();
    std::shared_ptr<boost::optional<int>_>::operator=
              (value,(shared_ptr<boost::optional<int>_> *)
                     &v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<boost::optional<int>_>::~shared_ptr
              ((shared_ptr<boost::optional<int>_> *)
               &v.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,match,2);
    std::
    function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&stack0xffffffffffffffa8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
    std::__cxx11::string::~string((string *)&local_78);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffa8);
    if (bVar1) {
      v_00 = std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &stack0xffffffffffffffa8);
      optional_traits<boost::optional<int>,_void>::construct(v_00);
      copy_shared<boost::optional<int>>((optional<int> *)&local_100);
      std::shared_ptr<boost::optional<int>_>::operator=(value,&local_100);
      std::shared_ptr<boost::optional<int>_>::~shared_ptr(&local_100);
    }
    else {
      widen<std::__cxx11::string>(&local_c8,(detail *)"invalid argument: ",s);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_e8,match,0);
      std::operator+(&local_a8,&local_c8,&local_e8);
      std::__cxx11::string::operator=((string *)err,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    local_ec = (uint)!bVar1;
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&stack0xffffffffffffffa8);
  }
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        if (!match[2].matched) {
            value = std::make_shared<Value>();
        } else {
            auto const v = flg.read(match.str(2));
            if (!v) {
                err = widen<String>("invalid argument: ") + match.str(0);
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }